

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_16_toc_i(void)

{
  uint value;
  
  value = m68ki_read_imm_16();
  m68ki_set_ccr(value);
  return;
}

Assistant:

static void m68k_op_move_16_toc_i(void)
{
	m68ki_set_ccr(OPER_I_16());
}